

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate_suite.cpp
# Opt level: O0

void accumulate_array_real_with_integer(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_2f0;
  undefined4 local_2e4;
  type_conflict4 local_2e0;
  undefined1 local_2db;
  undefined1 local_2da [2];
  basic_variable<std::allocator<char>_> local_2d8;
  iterator local_2a8;
  iterator local_290;
  undefined1 local_278 [8];
  variable result;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_228,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1f8,2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1c8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_198,4.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_168,5.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,6.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,7.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d8,8.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,9.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_78,10.0);
  local_48._0_8_ = &local_228;
  local_48._8_8_ = 10;
  init._M_len = in_RCX;
  init._M_array = (iterator)0xa;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_2f0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_2f0 = local_2f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2f0);
  } while (local_2f0 != &local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_290,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2d8,0);
  std::
  accumulate<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            ((basic_variable<std::allocator<char>_> *)local_278,&local_290,&local_2a8,&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_290);
  local_2da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_278);
  local_2db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0x8f,"void accumulate_array_real_with_integer()",local_2da,&local_2db);
  local_2e0 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_278);
  local_2e4 = 0x37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","55",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/accumulate_suite.cpp"
             ,0x90,"void accumulate_array_real_with_integer()",&local_2e0,&local_2e4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void accumulate_array_real_with_integer()
{
    variable data = array::make({ 1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0 });
    variable result = std::accumulate(data.begin(), data.end(), variable(0));
    TRIAL_PROTOCOL_TEST_EQUAL(result.is<int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 55);
}